

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cc
# Opt level: O0

void __thiscall tt::net::Epoll::epoll_add(Epoll *this,SP_Channel *request,int timeout)

{
  int iVar1;
  element_type *peVar2;
  __uint32_t *p_Var3;
  undefined1 local_5c [8];
  epoll_event event;
  shared_ptr<tt::net::Channel> local_30;
  int local_20;
  int local_1c;
  int fd;
  int timeout_local;
  SP_Channel *request_local;
  Epoll *this_local;
  
  local_1c = timeout;
  _fd = request;
  request_local = (SP_Channel *)this;
  peVar2 = std::__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)request);
  local_20 = Channel::getFd(peVar2);
  if (0 < local_1c) {
    std::shared_ptr<tt::net::Channel>::shared_ptr(&local_30,request);
    add_timer(this,&local_30,local_1c);
    std::shared_ptr<tt::net::Channel>::~shared_ptr(&local_30);
    std::__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               request);
    Channel::getHolder((Channel *)&event.data);
    std::shared_ptr<tt::net::HttpData>::operator=
              (this->m_fd2http + local_20,(shared_ptr<tt::net::HttpData> *)&event.data);
    std::shared_ptr<tt::net::HttpData>::~shared_ptr((shared_ptr<tt::net::HttpData> *)&event.data);
  }
  local_5c._4_4_ = local_20;
  peVar2 = std::__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)request);
  p_Var3 = Channel::getEvents(peVar2);
  local_5c._0_4_ = *p_Var3;
  peVar2 = std::__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)request);
  Channel::EqualAndUpdateLastEvents(peVar2);
  std::shared_ptr<tt::net::Channel>::operator=(this->m_fd2chan + local_20,request);
  iVar1 = epoll_ctl(this->m_epollFd,1,local_20,(epoll_event *)local_5c);
  if (iVar1 < 0) {
    perror("epoll_add error");
    std::__shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>::reset
              (&this->m_fd2chan[local_20].
                super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>);
  }
  return;
}

Assistant:

void Epoll::epoll_add(SP_Channel request, int timeout){
	
	int fd = request->getFd();

	if(timeout > 0){
		add_timer(request, timeout);
		m_fd2http[fd] = request->getHolder();
	}


	struct epoll_event event;
	
	event.data.fd = fd;
	event.events  =request->getEvents();
	
	request->EqualAndUpdateLastEvents();
	m_fd2chan[fd] = request;

	if(epoll_ctl(m_epollFd, EPOLL_CTL_ADD, fd, &event) < 0){
		perror("epoll_add error");
		m_fd2chan[fd].reset();
	}

}